

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzinterpolationspace.cpp
# Opt level: O1

void __thiscall
TPZInterpolationSpace::MinMaxSolutionValues
          (TPZInterpolationSpace *this,TPZVec<double> *min,TPZVec<double> *max)

{
  double *pdVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  long *plVar7;
  TPZIntPoints *pTVar8;
  ulong uVar9;
  long size;
  uint uVar10;
  ulong uVar11;
  TPZAutoPointer<TPZIntPoints> intrule;
  TPZManVector<int,_3> prevorder;
  REAL weight;
  TPZManVector<int,_3> maxorder;
  TPZManVector<double,_3> intpoint;
  TPZFNMatrix<9,_double> axes;
  TPZMaterialDataT<double> data;
  TPZAutoPointer<TPZIntPoints> local_8400;
  uint local_83f4;
  TPZVec<double> *local_83f0;
  TPZVec<double> *local_83e8;
  TPZManVector<int,_3> local_83e0;
  undefined1 local_83b0 [8];
  TPZManVector<int,_3> local_83a8;
  TPZManVector<double,_3> local_8378;
  TPZFMatrix<double> local_8340;
  double local_82b0 [10];
  TPZMaterialDataT<double> local_8260;
  
  local_83f0 = max;
  local_83e8 = min;
  iVar6 = (**(code **)(*(long *)&this->super_TPZCompEl + 0xb0))();
  size = (long)iVar6;
  local_8260.super_TPZMaterialData.super_TPZShapeData._0_8_ = (undefined **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_8378,size,(double *)&local_8260);
  plVar7 = (long *)(**(code **)(*(long *)&this->super_TPZCompEl + 0x2c8))(this);
  pTVar8 = (TPZIntPoints *)(**(code **)(*plVar7 + 0x48))(plVar7);
  local_8400.fRef = (TPZReference *)operator_new(0x10);
  ((local_8400.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_8400.fRef)->fPointer = pTVar8;
  LOCK();
  ((local_8400.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  local_8260.super_TPZMaterialData.super_TPZShapeData._0_8_ =
       local_8260.super_TPZMaterialData.super_TPZShapeData._0_8_ & 0xffffffff00000000;
  TPZManVector<int,_3>::TPZManVector(&local_83e0,size,(int *)&local_8260);
  (*(local_8400.fRef)->fPointer->_vptr_TPZIntPoints[6])((local_8400.fRef)->fPointer,&local_83e0);
  iVar6 = (*(local_8400.fRef)->fPointer->_vptr_TPZIntPoints[7])();
  local_8260.super_TPZMaterialData.super_TPZShapeData._0_4_ = iVar6;
  TPZManVector<int,_3>::TPZManVector(&local_83a8,size,(int *)&local_8260);
  (*(local_8400.fRef)->fPointer->_vptr_TPZIntPoints[5])((local_8400.fRef)->fPointer,&local_83a8,0);
  local_8340.fElem = local_82b0;
  local_8340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_8340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_8340.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_8340.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_8340.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_8340.fSize = 9;
  local_8340.fGiven = local_8340.fElem;
  TPZVec<int>::TPZVec(&local_8340.fPivot.super_TPZVec<int>,0);
  local_8340.fPivot.super_TPZVec<int>.fStore = local_8340.fPivot.fExtAlloc;
  local_8340.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_8340.fPivot.super_TPZVec<int>.fNElements = 0;
  local_8340.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_8340.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_8340.fWork.fStore = (double *)0x0;
  local_8340.fWork.fNElements = 0;
  local_8340.fWork.fNAlloc = 0;
  local_8340.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  TPZFMatrix<double>::operator=(&local_8340,0.0);
  TPZMaterialDataT<double>::TPZMaterialDataT(&local_8260);
  local_83f4 = (*(local_8400.fRef)->fPointer->_vptr_TPZIntPoints[3])();
  (*(local_8400.fRef)->fPointer->_vptr_TPZIntPoints[4])
            ((local_8400.fRef)->fPointer,0,&local_8378,local_83b0);
  (**(code **)(*(long *)&this->super_TPZCompEl + 0x298))(this,&local_8260);
  local_8260.super_TPZMaterialData.fNeedsSol = true;
  (**(code **)(*(long *)&this->super_TPZCompEl + 0x2a8))(this,&local_8260,&local_8378);
  TPZVec<double>::operator=
            (local_83e8,
             &(local_8260.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore)->super_TPZVec<double>)
  ;
  TPZVec<double>::operator=
            (local_83f0,
             &(local_8260.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore)->super_TPZVec<double>)
  ;
  if (1 < (int)local_83f4) {
    uVar11 = 1;
    do {
      (*(local_8400.fRef)->fPointer->_vptr_TPZIntPoints[4])
                ((local_8400.fRef)->fPointer,uVar11,&local_8378,local_83b0);
      (**(code **)(*(long *)&this->super_TPZCompEl + 0x298))(this,&local_8260);
      local_8260.super_TPZMaterialData.fNeedsSol = true;
      (**(code **)(*(long *)&this->super_TPZCompEl + 0x2a8))(this,&local_8260,&local_8378);
      if (0 < (int)(uint)local_8260.sol.super_TPZVec<TPZManVector<double,_10>_>.fNElements) {
        pdVar3 = ((local_8260.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore)->
                 super_TPZVec<double>).fStore;
        pdVar4 = local_83e8->fStore;
        pdVar5 = local_83f0->fStore;
        uVar9 = 0;
        do {
          dVar2 = pdVar3[uVar9];
          if (dVar2 < pdVar4[uVar9]) {
            pdVar4[uVar9] = dVar2;
          }
          dVar2 = pdVar3[uVar9];
          pdVar1 = pdVar5 + uVar9;
          if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
            pdVar5[uVar9] = dVar2;
          }
          uVar9 = uVar9 + 1;
        } while (((uint)local_8260.sol.super_TPZVec<TPZManVector<double,_10>_>.fNElements &
                 0x7fffffff) != uVar9);
      }
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
    } while (uVar10 != local_83f4);
  }
  (*(local_8400.fRef)->fPointer->_vptr_TPZIntPoints[5])((local_8400.fRef)->fPointer,&local_83e0,0);
  local_8260.super_TPZMaterialData.super_TPZShapeData._0_8_ = &PTR__TPZMaterialDataT_018e86d8;
  TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
            ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x7950));
  TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
            ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x7070));
  TPZManVector<TPZFNMatrix<30,_double>,_20>::~TPZManVector
            ((TPZManVector<TPZFNMatrix<30,_double>,_20> *)((long)&local_8260 + 0x51b0));
  TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
            ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x48d0));
  TPZMaterialData::~TPZMaterialData(&local_8260.super_TPZMaterialData,&PTR_PTR_018e8740);
  TPZFMatrix<double>::~TPZFMatrix(&local_8340,&PTR_PTR_0183dba8);
  if (local_83a8.super_TPZVec<int>.fStore == local_83a8.fExtAlloc) {
    local_83a8.super_TPZVec<int>.fStore = (int *)0x0;
  }
  local_83a8.super_TPZVec<int>.fNAlloc = 0;
  local_83a8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_83a8.super_TPZVec<int>.fStore != (int *)0x0) {
    operator_delete__(local_83a8.super_TPZVec<int>.fStore);
  }
  if (local_83e0.super_TPZVec<int>.fStore == local_83e0.fExtAlloc) {
    local_83e0.super_TPZVec<int>.fStore = (int *)0x0;
  }
  local_83e0.super_TPZVec<int>.fNAlloc = 0;
  local_83e0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_83e0.super_TPZVec<int>.fStore != (int *)0x0) {
    operator_delete__(local_83e0.super_TPZVec<int>.fStore);
  }
  TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer(&local_8400);
  TPZManVector<double,_3>::~TPZManVector(&local_8378);
  return;
}

Assistant:

void TPZInterpolationSpace::MinMaxSolutionValues(TPZVec<STATE> &min, TPZVec<STATE> &max){
	
	const int dim = Dimension();
	TPZManVector<REAL,3> intpoint(dim,0.);
	
	TPZAutoPointer<TPZIntPoints> intrule = GetIntegrationRule().Clone();
	TPZManVector<int,3> prevorder(dim,0);
	intrule->GetOrder(prevorder);
	
	TPZManVector<int,3> maxorder(dim,intrule->GetMaxOrder());
	intrule->SetOrder(maxorder);
	
	
	TPZFNMatrix<9> axes(3,3,0.);
	REAL weight;
	TPZMaterialDataT<STATE> data;
    constexpr bool hasPhi{false};
	const int intrulepoints = intrule->NPoints();
	intrule->Point(0,intpoint,weight);
    
	this->ComputeSolution(intpoint, data,hasPhi);
	min = data.sol[0];
	max = data.sol[0];
	const int nvars = data.sol.NElements();
	for(int int_ind = 1; int_ind < intrulepoints; int_ind++){
		intrule->Point(int_ind,intpoint,weight);
		this->ComputeSolution(intpoint, data,hasPhi);
        TPZSolVec<STATE> &sol = data.sol;
		for(int iv = 0; iv < nvars; iv++){
			if (sol[0][iv] < min[iv]) min[iv] = sol[0][iv];
			if (sol[0][iv] > max[iv]) max[iv] = sol[0][iv];
		}//iv
	}//loop over integratin points
	
	intrule->SetOrder(prevorder);
	
}